

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O1

sx__job * sx__new_job(sx_job_context *ctx,int index,sx_job_cb *callback,void *user,int range_start,
                     int range_end,sx_job_t counter,uint32_t tags,sx_job_priority priority)

{
  int iVar1;
  code *pcVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  sx__pool_page *psVar5;
  _Bool _Var6;
  sx_fiber_t pvVar7;
  sx__job *psVar8;
  sx__pool_page *psVar9;
  sx_fiber_stack stack;
  
  psVar5 = ctx->job_pool->pages;
  do {
    psVar9 = psVar5;
    iVar1 = psVar9->iter;
    if (iVar1 != 0) break;
    psVar5 = psVar9->next;
  } while (psVar9->next != (sx__pool_page *)0x0);
  if (iVar1 < 1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                      ,0x8f,"capacity is full");
    pcVar2 = (code *)swi(3);
    psVar8 = (sx__job *)(*pcVar2)();
    return psVar8;
  }
  psVar9->iter = iVar1 - 1U;
  psVar8 = (sx__job *)psVar9->ptrs[iVar1 - 1U];
  if (psVar8 != (sx__job *)0x0) {
    psVar8->job_index = index;
    psVar8->tags = tags;
    psVar8->done = 0;
    psVar8->owner_tid = 0;
    if ((psVar8->stack_mem).sptr == (void *)0x0) {
      _Var6 = sx_fiber_stack_init(&psVar8->stack_mem,ctx->stack_sz);
      if (!_Var6) {
        sx__mem_run_fail_callback
                  ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",0x81);
        sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                          ,0x81,"Out of memory");
        pcVar2 = (code *)swi(3);
        psVar8 = (sx__job *)(*pcVar2)();
        return psVar8;
      }
    }
    uVar3 = (psVar8->stack_mem).sptr;
    uVar4 = (psVar8->stack_mem).ssize;
    stack.ssize = uVar4;
    stack.sptr = (void *)uVar3;
    stack._12_4_ = 0;
    pvVar7 = sx_fiber_create(stack,fiber_fn);
    psVar8->fiber = pvVar7;
    psVar8->counter = counter;
    psVar8->wait_counter = &ctx->dummy_counter;
    psVar8->ctx = ctx;
    psVar8->callback = callback;
    psVar8->user = user;
    psVar8->range_start = range_start;
    psVar8->range_end = range_end;
    psVar8->priority = priority;
    psVar8->next = (sx__job *)0x0;
    psVar8->prev = (sx__job *)0x0;
  }
  return psVar8;
}

Assistant:

static sx__job* sx__new_job(sx_job_context* ctx, int index, sx_job_cb* callback, void* user,
                            int range_start, int range_end, sx_job_t counter, uint32_t tags,
                            sx_job_priority priority)
{
    sx__job* j = (sx__job*)sx_pool_new(ctx->job_pool);

    if (j) {
        j->job_index = index;
        j->owner_tid = 0;
        j->tags = tags;
        j->done = 0;
        if (!j->stack_mem.sptr) {
            // Initialize stack memory
            if (!sx_fiber_stack_init(&j->stack_mem, ctx->stack_sz)) {
                sx_out_of_memory();
                return NULL;
            }
        }
        j->fiber = sx_fiber_create(j->stack_mem, fiber_fn);
        j->counter = counter;
        j->wait_counter = &ctx->dummy_counter;
        j->ctx = ctx;
        j->callback = callback;
        j->user = user;
        j->range_start = range_start;
        j->range_end = range_end;
        j->priority = priority;
        j->next = j->prev = NULL;
    }
    return j;
}